

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteUTF16String(ON_BinaryArchive *this,unsigned_short *sUTF16)

{
  unsigned_short *puVar1;
  bool bVar2;
  size_t sVar3;
  size_t count;
  ON__UINT32 ui32;
  ON__INT32 local_1c;
  
  if (sUTF16 == (unsigned_short *)0x0) {
    count = 0;
  }
  else {
    sVar3 = 0;
    do {
      puVar1 = sUTF16 + sVar3;
      sVar3 = sVar3 + 1;
    } while (*puVar1 != 0);
    count = 0;
    if (sVar3 != 1) {
      count = sVar3;
    }
  }
  local_1c = (ON__INT32)count;
  bVar2 = WriteInt32(this,1,&local_1c);
  if (count != 0 && bVar2) {
    bVar2 = WriteInt16(this,count,(ON__INT16 *)sUTF16);
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::WriteUTF16String(  
  const unsigned short* sUTF16
  )
{
  // Write nullptr terminated UTF-16 encoded unicode string
  size_t string_utf16_element_count = 0;
  if ( sUTF16 )
  {
    while(sUTF16[string_utf16_element_count])
      string_utf16_element_count++;
    if ( string_utf16_element_count )
      string_utf16_element_count++;
  }
  ON__UINT32 ui32 = (ON__UINT32)string_utf16_element_count;
  bool rc = WriteInt32(1,(ON__INT32*)&ui32);
  if ( rc && string_utf16_element_count > 0 )
  {
    rc = WriteShort( string_utf16_element_count, sUTF16 );
  }
  return rc;  
}